

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QCborSimpleType st)

{
  undefined *puVar1;
  DataPointer *pDVar2;
  storage_type *in_RCX;
  undefined **ppuVar3;
  byte in_DL;
  undefined7 in_register_00000031;
  QDebug *dbg_00;
  QString *this;
  Stream *pSVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  dbg_00 = (QDebug *)CONCAT71(in_register_00000031,st);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,dbg_00);
  if ((byte)(in_DL - 0x14) < 4) {
    puVar1 = (&PTR_anon_var_dwarf_a34034_0069bd98)[(byte)(in_DL - 0x14)];
    pSVar4 = dbg_00->stream;
    pSVar4->space = false;
    ba.m_data = (storage_type *)&PTR_anon_var_dwarf_a34034_0069bd98;
    ba.m_size = (qsizetype)"QCborSimpleType::";
    ppuVar3 = &PTR_anon_var_dwarf_a34034_0069bd98;
    QString::fromUtf8(&local_40,(QString *)0x11,ba);
    QTextStream::operator<<(&pSVar4->ts,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar4 = dbg_00->stream;
    if (pSVar4->space == true) {
      QTextStream::operator<<(&pSVar4->ts,' ');
      pSVar4 = dbg_00->stream;
    }
    this = (QString *)0xffffffffffffffff;
    do {
      pDVar2 = &this->d;
      this = (QString *)((long)&(this->d).d + 1);
    } while ((puVar1 + 1)[(long)&pDVar2->d] != '\0');
    ba_00.m_data = (storage_type *)ppuVar3;
    ba_00.m_size = (qsizetype)puVar1;
    QString::fromUtf8(&local_40,this,ba_00);
    QTextStream::operator<<(&pSVar4->ts,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar4 = dbg_00->stream;
    if (pSVar4->space == false) goto LAB_002e4e5f;
  }
  else {
    pSVar4 = dbg_00->stream;
    pSVar4->space = false;
    ba_01.m_data = in_RCX;
    ba_01.m_size = (qsizetype)"QCborSimpleType(";
    QString::fromUtf8(&local_40,(QString *)0x10,ba_01);
    QTextStream::operator<<(&pSVar4->ts,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar4 = dbg_00->stream;
    if (pSVar4->space == true) {
      QTextStream::operator<<(&pSVar4->ts,' ');
      pSVar4 = dbg_00->stream;
    }
    QTextStream::operator<<(&pSVar4->ts,(uint)in_DL);
    pSVar4 = dbg_00->stream;
    if (pSVar4->space == true) {
      QTextStream::operator<<(&pSVar4->ts,' ');
      pSVar4 = dbg_00->stream;
    }
    QTextStream::operator<<(&pSVar4->ts,')');
    pSVar4 = dbg_00->stream;
    if (pSVar4->space != true) goto LAB_002e4e5f;
  }
  QTextStream::operator<<(&pSVar4->ts,' ');
  pSVar4 = dbg_00->stream;
LAB_002e4e5f:
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar4;
  pSVar4->ref = pSVar4->ref + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, QCborSimpleType st)
{
    QDebugStateSaver saver(dbg);
    const char *id = qt_cbor_simpletype_id(st);
    if (id)
        return dbg.nospace() << "QCborSimpleType::" << id;

    return dbg.nospace() << "QCborSimpleType(" << uint(st) << ')';
}